

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

BayesianProbitRegressor_FeatureValueWeight * __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::New
          (BayesianProbitRegressor_FeatureValueWeight *this,Arena *arena)

{
  BayesianProbitRegressor_FeatureValueWeight *this_00;
  
  this_00 = (BayesianProbitRegressor_FeatureValueWeight *)operator_new(0x20);
  BayesianProbitRegressor_FeatureValueWeight(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

BayesianProbitRegressor_FeatureValueWeight* BayesianProbitRegressor_FeatureValueWeight::New(::google::protobuf::Arena* arena) const {
  BayesianProbitRegressor_FeatureValueWeight* n = new BayesianProbitRegressor_FeatureValueWeight;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}